

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O0

int next_marker(void)

{
  int iVar1;
  int discarded_bytes;
  int c;
  int local_8;
  int local_4;
  
  local_4 = read_1_byte();
  local_8 = 0;
  while (local_4 != 0xff) {
    local_8 = local_8 + 1;
    local_4 = read_1_byte();
  }
  do {
    iVar1 = read_1_byte();
  } while (iVar1 == 0xff);
  if (local_8 != 0) {
    fprintf(_stderr,"Warning: garbage data found in JPEG file\n");
  }
  return iVar1;
}

Assistant:

static int
next_marker(void)
{
  int c;
  int discarded_bytes = 0;

  /* Find 0xFF byte; count and skip any non-FFs. */
  c = read_1_byte();
  while (c != 0xFF) {
    discarded_bytes++;
    c = read_1_byte();
  }
  /* Get marker code byte, swallowing any duplicate FF bytes.  Extra FFs
   * are legal as pad bytes, so don't count them in discarded_bytes.
   */
  do {
    c = read_1_byte();
  } while (c == 0xFF);

  if (discarded_bytes != 0) {
    fprintf(stderr, "Warning: garbage data found in JPEG file\n");
  }

  return c;
}